

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFieldPacked_Test::
FeaturesTest_InvalidFieldPacked_Test(FeaturesTest_InvalidFieldPacked_Test *this)

{
  FeaturesTest_InvalidFieldPacked_Test *this_local;
  
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FeaturesTest_InvalidFieldPacked_Test_029ad858;
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldPacked) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        message_type {
          name: "Foo"
          field {
            name: "bar"
            number: 1
            label: LABEL_REPEATED
            type: TYPE_INT64
            options { packed: true }
          }
        }
      )pb",
      "foo.proto: Foo.bar: NAME: Field option packed is not allowed under "
      "editions.  Use the repeated_field_encoding feature to control this "
      "behavior.\n");
}